

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<QToolBarAreaLayoutLine>::emplace<QToolBarAreaLayoutLine>
          (QMovableArrayOps<QToolBarAreaLayoutLine> *this,qsizetype i,QToolBarAreaLayoutLine *args)

{
  QToolBarAreaLayoutLine **ppQVar1;
  qsizetype *pqVar2;
  long lVar3;
  Data *pDVar4;
  qsizetype qVar5;
  long in_FS_OFFSET;
  bool bVar6;
  Inserter local_80;
  QToolBarAreaLayoutLine tmp;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar4 = (this->super_QGenericArrayOps<QToolBarAreaLayoutLine>).
           super_QArrayDataPointer<QToolBarAreaLayoutLine>.d;
  if ((pDVar4 != (Data *)0x0) &&
     ((__int_type)(pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> < 2)) {
    if ((this->super_QGenericArrayOps<QToolBarAreaLayoutLine>).
        super_QArrayDataPointer<QToolBarAreaLayoutLine>.size == i) {
      qVar5 = QArrayDataPointer<QToolBarAreaLayoutLine>::freeSpaceAtEnd
                        ((QArrayDataPointer<QToolBarAreaLayoutLine> *)this);
      if (qVar5 == 0) goto LAB_00471b9b;
      QToolBarAreaLayoutLine::QToolBarAreaLayoutLine
                ((this->super_QGenericArrayOps<QToolBarAreaLayoutLine>).
                 super_QArrayDataPointer<QToolBarAreaLayoutLine>.ptr +
                 (this->super_QGenericArrayOps<QToolBarAreaLayoutLine>).
                 super_QArrayDataPointer<QToolBarAreaLayoutLine>.size,args);
LAB_00471c8a:
      pqVar2 = &(this->super_QGenericArrayOps<QToolBarAreaLayoutLine>).
                super_QArrayDataPointer<QToolBarAreaLayoutLine>.size;
      *pqVar2 = *pqVar2 + 1;
      goto LAB_00471c49;
    }
LAB_00471b9b:
    if (i == 0) {
      qVar5 = QArrayDataPointer<QToolBarAreaLayoutLine>::freeSpaceAtBegin
                        ((QArrayDataPointer<QToolBarAreaLayoutLine> *)this);
      if (qVar5 != 0) {
        QToolBarAreaLayoutLine::QToolBarAreaLayoutLine
                  ((this->super_QGenericArrayOps<QToolBarAreaLayoutLine>).
                   super_QArrayDataPointer<QToolBarAreaLayoutLine>.ptr + -1,args);
        ppQVar1 = &(this->super_QGenericArrayOps<QToolBarAreaLayoutLine>).
                   super_QArrayDataPointer<QToolBarAreaLayoutLine>.ptr;
        *ppQVar1 = *ppQVar1 + -1;
        goto LAB_00471c8a;
      }
    }
  }
  tmp.toolBarItems.d.ptr = (QToolBarAreaLayoutItem *)&DAT_aaaaaaaaaaaaaaaa;
  tmp.toolBarItems.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  tmp._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  tmp.toolBarItems.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  tmp.rect._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  tmp.rect._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QToolBarAreaLayoutLine::QToolBarAreaLayoutLine(&tmp,args);
  bVar6 = (this->super_QGenericArrayOps<QToolBarAreaLayoutLine>).
          super_QArrayDataPointer<QToolBarAreaLayoutLine>.size != 0;
  QArrayDataPointer<QToolBarAreaLayoutLine>::detachAndGrow
            ((QArrayDataPointer<QToolBarAreaLayoutLine> *)this,(uint)(i == 0 && bVar6),1,
             (QToolBarAreaLayoutLine **)0x0,(QArrayDataPointer<QToolBarAreaLayoutLine> *)0x0);
  if (i == 0 && bVar6) {
    QToolBarAreaLayoutLine::QToolBarAreaLayoutLine
              ((this->super_QGenericArrayOps<QToolBarAreaLayoutLine>).
               super_QArrayDataPointer<QToolBarAreaLayoutLine>.ptr + -1,&tmp);
    ppQVar1 = &(this->super_QGenericArrayOps<QToolBarAreaLayoutLine>).
               super_QArrayDataPointer<QToolBarAreaLayoutLine>.ptr;
    *ppQVar1 = *ppQVar1 + -1;
    pqVar2 = &(this->super_QGenericArrayOps<QToolBarAreaLayoutLine>).
              super_QArrayDataPointer<QToolBarAreaLayoutLine>.size;
    *pqVar2 = *pqVar2 + 1;
  }
  else {
    Inserter::Inserter(&local_80,(QArrayDataPointer<QToolBarAreaLayoutLine> *)this,i,1);
    QToolBarAreaLayoutLine::QToolBarAreaLayoutLine(local_80.displaceFrom,&tmp);
    local_80.displaceFrom = local_80.displaceFrom + 1;
    (local_80.data)->size = (local_80.data)->size + local_80.nInserts;
  }
  QArrayDataPointer<QToolBarAreaLayoutItem>::~QArrayDataPointer(&tmp.toolBarItems.d);
LAB_00471c49:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }